

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

int lws_wsi_txc_check_skint(lws_tx_credit *txc,int32_t tx_cr)

{
  int32_t tx_cr_local;
  lws_tx_credit *txc_local;
  
  if (txc->tx_cr < 1) {
    if (txc->skint == '\0') {
      _lws_log(8,"%s: %p: skint (%d)\n","lws_wsi_txc_check_skint",txc,(ulong)(uint)txc->tx_cr);
    }
    txc->skint = '\x01';
    txc_local._4_4_ = 1;
  }
  else {
    if (txc->skint != '\0') {
      _lws_log(8,"%s: %p: unskint (%d)\n","lws_wsi_txc_check_skint",txc,(ulong)(uint)txc->tx_cr);
    }
    txc->skint = '\0';
    txc_local._4_4_ = 0;
  }
  return txc_local._4_4_;
}

Assistant:

int
lws_wsi_txc_check_skint(struct lws_tx_credit *txc, int32_t tx_cr)
{
	if (txc->tx_cr <= 0) {
		/*
		 * If other side is not able to cope with us sending any DATA
		 * so no matter if we have POLLOUT on our side if it's DATA we
		 * want to send.
		 */

		if (!txc->skint)
			lwsl_info("%s: %p: skint (%d)\n", __func__, txc,
				  (int)txc->tx_cr);

		txc->skint = 1;

		return 1;
	}

	if (txc->skint)
		lwsl_info("%s: %p: unskint (%d)\n", __func__, txc,
			  (int)txc->tx_cr);

	txc->skint = 0;

	return 0;
}